

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O1

char * __thiscall Fl_Comment_Type::title(Fl_Comment_Type *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  
  pcVar6 = (this->super_Fl_Type).name_;
  if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
    iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])();
    return (char *)CONCAT44(extraout_var,iVar3);
  }
  pcVar5 = this->title_buf;
  pcVar4 = pcVar5;
  if (this->title_buf[0] != '\0') {
    return pcVar4;
  }
  iVar3 = 0x32;
  do {
    iVar7 = iVar3 + -1;
    if (iVar3 < 2) break;
    cVar1 = *pcVar6;
    if (cVar1 == '\0') {
      bVar2 = false;
    }
    else {
      if (cVar1 == '\n') {
        pcVar5[0] = '\\';
        pcVar5[1] = 'n';
      }
      else if (cVar1 == '\r') {
        pcVar5[0] = '\\';
        pcVar5[1] = 'r';
      }
      else {
        if ('\x1f' < cVar1) {
          *pcVar5 = cVar1;
          pcVar5 = pcVar5 + 1;
          bVar2 = true;
          goto LAB_0017c034;
        }
        *pcVar5 = '^';
        pcVar5[1] = cVar1 + 'A';
      }
      pcVar5 = pcVar5 + 2;
      iVar7 = iVar3 + -2;
      bVar2 = true;
    }
LAB_0017c034:
    pcVar6 = pcVar6 + 1;
    iVar3 = iVar7;
  } while (bVar2);
  if (iVar7 < 1) {
    pcVar5[0] = '.';
    pcVar5[1] = '.';
    pcVar5[2] = '.';
    pcVar5 = pcVar5 + 3;
  }
  *pcVar5 = '\0';
  return pcVar4;
}

Assistant:

const char *name() const {return name_;}